

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::TopUpWithDB
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,uint size)

{
  key_type *__k;
  _Rb_tree_header *p_Var1;
  WalletDescriptor *descriptor;
  DescriptorCache *this_00;
  int64_t iVar2;
  element_type *peVar3;
  WalletStorage *pWVar4;
  pointer pCVar5;
  pointer pCVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  const_iterator cVar11;
  _Rb_tree_node_base *p_Var12;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  CScript *script;
  pointer __v;
  key_type *__k_00;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  DescriptorCache new_items;
  DescriptorCache temp_cache;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  FlatSigningProvider out_keys;
  uint256 id;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> new_spks;
  DescriptorCache local_438;
  DescriptorCache local_390;
  vector<CScript,_std::allocator<CScript>_> local_2e8;
  unique_lock<std::recursive_mutex> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  size_type *local_298;
  size_type local_290;
  size_type local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  _Base_ptr local_268;
  _Base_ptr local_260;
  _Base_ptr p_Stack_258;
  _Base_ptr local_250;
  undefined8 local_248;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_240;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_210;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  _Stack_1e0;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_1b0;
  uint256 local_180;
  undefined **local_160;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_158;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_128;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_f8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_c8;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_98;
  _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c8._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_2c8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_2c8);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = this->m_keypool_size;
  iVar9 = (this->m_wallet_descriptor).next_index;
  uVar15 = (this->m_wallet_descriptor).range_end;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar8 = (*((this->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Descriptor[2]
          )();
  uVar16 = (uint)iVar2;
  if (size != 0) {
    uVar16 = size;
  }
  uVar16 = uVar16 + iVar9;
  if ((int)uVar16 <= (int)uVar15) {
    uVar16 = uVar15;
  }
  if ((char)iVar8 == '\0') {
    (this->m_wallet_descriptor).range_start = 0;
    (this->m_wallet_descriptor).range_end = 1;
    uVar16 = 1;
  }
  local_158._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_158._M_impl.super__Rb_tree_header._M_header;
  local_160 = &PTR__FlatSigningProvider_006bfd40;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_c8._M_impl.super__Rb_tree_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_impl.super__Rb_tree_header._M_header._M_right =
       local_158._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  GetKeys((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *)
          local_278,this);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::clear(&local_c8);
  if (local_268 != (_Base_ptr)0x0) {
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = local_278._8_4_;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = local_268;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left = local_260;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_258;
    local_268->_M_parent = &p_Var1->_M_header;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_250;
    local_268 = (_Base_ptr)0x0;
    local_250 = (_Base_ptr)0x0;
    local_260 = (_Base_ptr)(local_278 + 8);
    p_Stack_258 = (_Base_ptr)(local_278 + 8);
  }
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
               *)local_278);
  (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_180,this);
  descriptor = &this->m_wallet_descriptor;
  uVar15 = this->m_max_cached_index + 1;
  bVar7 = true;
  if ((int)uVar15 < (int)uVar16) {
    p_Var1 = &_Stack_1e0._M_impl.super__Rb_tree_header;
    this_00 = &(this->m_wallet_descriptor).cache;
    bVar7 = false;
    do {
      local_278._0_8_ = &PTR__FlatSigningProvider_006bfd40;
      local_268 = (_Base_ptr)((ulong)local_268 & 0xffffffff00000000);
      local_260 = (_Base_ptr)0x0;
      p_Stack_258 = (_Base_ptr)&local_268;
      local_248 = 0;
      local_240._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_240._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_240._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_240._M_impl.super__Rb_tree_header._M_header;
      local_240._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_210._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_210._M_impl.super__Rb_tree_header._M_header;
      local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1b0._M_impl.super__Rb_tree_header._M_header;
      local_1b0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_start = (CScript *)0x0;
      local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_finish = (CScript *)0x0;
      local_390.m_derived_xpubs._M_h._M_buckets = &local_390.m_derived_xpubs._M_h._M_single_bucket;
      local_390.m_derived_xpubs._M_h._M_bucket_count = 1;
      local_390.m_derived_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_390.m_derived_xpubs._M_h._M_element_count = 0;
      local_390.m_derived_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_390.m_derived_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
      local_390.m_derived_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_390.m_parent_xpubs._M_h._M_buckets = &local_390.m_parent_xpubs._M_h._M_single_bucket;
      local_390.m_parent_xpubs._M_h._M_bucket_count = 1;
      local_390.m_parent_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_390.m_parent_xpubs._M_h._M_element_count = 0;
      local_390.m_parent_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_390.m_parent_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
      local_390.m_parent_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_390.m_last_hardened_xpubs._M_h._M_bucket_count = 1;
      local_390.m_last_hardened_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_390.m_last_hardened_xpubs._M_h._M_element_count = 0;
      local_390.m_last_hardened_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_390.m_last_hardened_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
      local_390.m_last_hardened_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
      peVar3 = (descriptor->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_390.m_last_hardened_xpubs._M_h._M_buckets =
           &local_390.m_last_hardened_xpubs._M_h._M_single_bucket;
      local_250 = p_Stack_258;
      local_240._M_impl.super__Rb_tree_header._M_header._M_right =
           local_240._M_impl.super__Rb_tree_header._M_header._M_left;
      local_210._M_impl.super__Rb_tree_header._M_header._M_right =
           local_210._M_impl.super__Rb_tree_header._M_header._M_left;
      _Stack_1e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_1e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      local_1b0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar9 = (*peVar3->_vptr_Descriptor[9])(peVar3,(ulong)uVar15,this_00,&local_2e8,local_278);
      if (((char)iVar9 == '\0') &&
         (peVar3 = (descriptor->descriptor).
                   super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         iVar9 = (*peVar3->_vptr_Descriptor[8])
                           (peVar3,(ulong)uVar15,&local_160,&local_2e8,local_278,&local_390),
         (char)iVar9 == '\0')) {
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_390.m_last_hardened_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_390.m_parent_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_390);
        std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_2e8);
        std::
        _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
        ::~_Rb_tree(&local_1b0);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::~_Rb_tree(&_Stack_1e0);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
        ::~_Rb_tree(&local_210);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::~_Rb_tree(&local_240);
        std::
        _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
        ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                     *)(local_278 + 8));
        goto LAB_00223588;
      }
      pCVar5 = local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_438.m_derived_xpubs._M_h._M_buckets = (__buckets_ptr)&local_68;
      p_Var12 = local_240._M_impl.super__Rb_tree_header._M_header._M_left;
      __v = local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start;
      if (local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::
          _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
          ::
          _M_insert_unique_<CScript&,std::_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>::_Alloc_node>
                    ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                      *)&local_68,(const_iterator)&local_68._M_impl.super__Rb_tree_header,__v,
                     (_Alloc_node *)&local_438);
          pCVar6 = local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          __v = __v + 1;
          __k_00 = local_2e8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (__v != pCVar5);
        for (; p_Var12 = local_240._M_impl.super__Rb_tree_header._M_header._M_left, __k_00 != pCVar6
            ; __k_00 = __k_00 + 1) {
          puVar10 = (uint *)std::
                            map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
                            ::operator[](&this->m_map_script_pub_keys,__k_00);
          *puVar10 = uVar15;
        }
      }
      for (; (_Rb_tree_header *)p_Var12 != &local_240._M_impl.super__Rb_tree_header;
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        __k = (key_type *)((long)&p_Var12[1]._M_left + 4);
        cVar11 = std::
                 _Rb_tree<CPubKey,_std::pair<const_CPubKey,_int>,_std::_Select1st<std::pair<const_CPubKey,_int>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
                 ::find(&(this->m_map_pubkeys)._M_t,__k);
        if ((_Rb_tree_header *)cVar11._M_node ==
            &(this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header) {
          puVar10 = (uint *)std::
                            map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
                            ::operator[](&this->m_map_pubkeys,__k);
          *puVar10 = uVar15;
        }
      }
      DescriptorCache::MergeAndDiff(&local_438,this_00,&local_390);
      bVar7 = WalletBatch::WriteDescriptorCacheItems(batch,&local_180,&local_438);
      if (!bVar7) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"TopUpWithDB","");
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_2b8,": writing cache items failed");
        local_298 = (size_type *)(pbVar13->_M_dataplus)._M_p;
        paVar14 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298 == paVar14) {
          local_288 = paVar14->_M_allocated_capacity;
          uStack_280 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
          local_298 = &local_288;
        }
        else {
          local_288 = paVar14->_M_allocated_capacity;
        }
        local_290 = pbVar13->_M_string_length;
        (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar13->_M_string_length = 0;
        (pbVar13->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(this_01,(string *)&local_298);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_002238cd;
      }
      this->m_max_cached_index = this->m_max_cached_index + 1;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_438.m_last_hardened_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_438.m_parent_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_438);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_390.m_last_hardened_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_390.m_parent_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_390);
      std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_2e8);
      std::
      _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
      ::~_Rb_tree(&local_1b0);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::~_Rb_tree(&_Stack_1e0);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&local_210);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::~_Rb_tree(&local_240);
      std::
      _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
      ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                   *)(local_278 + 8));
      uVar15 = uVar15 + 1;
      bVar7 = (int)uVar16 <= (int)uVar15;
    } while (uVar15 != uVar16);
  }
  (this->m_wallet_descriptor).range_end = uVar16;
  (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_278,this);
  WalletBatch::WriteDescriptor(batch,(uint256 *)local_278,descriptor);
  if ((this->m_wallet_descriptor).range_end + -1 != this->m_max_cached_index) {
    __assert_fail("m_wallet_descriptor.range_end - 1 == m_max_cached_index",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x8de,
                  "bool wallet::DescriptorScriptPubKeyMan::TopUpWithDB(WalletBatch &, unsigned int)"
                 );
  }
  pWVar4 = (this->super_ScriptPubKeyMan).m_storage;
  (*pWVar4->_vptr_WalletStorage[0xb])(pWVar4,&local_68,this);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&(this->super_ScriptPubKeyMan).NotifyCanGetAddressesChanged);
LAB_00223588:
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_c8);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&local_f8);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&local_128);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_158);
  std::
  _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
  ::~_Rb_tree(&local_68);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_2c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
LAB_002238cd:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::TopUpWithDB(WalletBatch& batch, unsigned int size)
{
    LOCK(cs_desc_man);
    std::set<CScript> new_spks;
    unsigned int target_size;
    if (size > 0) {
        target_size = size;
    } else {
        target_size = m_keypool_size;
    }

    // Calculate the new range_end
    int32_t new_range_end = std::max(m_wallet_descriptor.next_index + (int32_t)target_size, m_wallet_descriptor.range_end);

    // If the descriptor is not ranged, we actually just want to fill the first cache item
    if (!m_wallet_descriptor.descriptor->IsRange()) {
        new_range_end = 1;
        m_wallet_descriptor.range_end = 1;
        m_wallet_descriptor.range_start = 0;
    }

    FlatSigningProvider provider;
    provider.keys = GetKeys();

    uint256 id = GetID();
    for (int32_t i = m_max_cached_index + 1; i < new_range_end; ++i) {
        FlatSigningProvider out_keys;
        std::vector<CScript> scripts_temp;
        DescriptorCache temp_cache;
        // Maybe we have a cached xpub and we can expand from the cache first
        if (!m_wallet_descriptor.descriptor->ExpandFromCache(i, m_wallet_descriptor.cache, scripts_temp, out_keys)) {
            if (!m_wallet_descriptor.descriptor->Expand(i, provider, scripts_temp, out_keys, &temp_cache)) return false;
        }
        // Add all of the scriptPubKeys to the scriptPubKey set
        new_spks.insert(scripts_temp.begin(), scripts_temp.end());
        for (const CScript& script : scripts_temp) {
            m_map_script_pub_keys[script] = i;
        }
        for (const auto& pk_pair : out_keys.pubkeys) {
            const CPubKey& pubkey = pk_pair.second;
            if (m_map_pubkeys.count(pubkey) != 0) {
                // We don't need to give an error here.
                // It doesn't matter which of many valid indexes the pubkey has, we just need an index where we can derive it and it's private key
                continue;
            }
            m_map_pubkeys[pubkey] = i;
        }
        // Merge and write the cache
        DescriptorCache new_items = m_wallet_descriptor.cache.MergeAndDiff(temp_cache);
        if (!batch.WriteDescriptorCacheItems(id, new_items)) {
            throw std::runtime_error(std::string(__func__) + ": writing cache items failed");
        }
        m_max_cached_index++;
    }
    m_wallet_descriptor.range_end = new_range_end;
    batch.WriteDescriptor(GetID(), m_wallet_descriptor);

    // By this point, the cache size should be the size of the entire range
    assert(m_wallet_descriptor.range_end - 1 == m_max_cached_index);

    m_storage.TopUpCallback(new_spks, this);
    NotifyCanGetAddressesChanged();
    return true;
}